

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O3

Fl_Widget * __thiscall
Fl_Check_Browser_Type::widget(Fl_Check_Browser_Type *this,int x,int y,int w,int h)

{
  Fl_Check_Browser *this_00;
  int i;
  uint uVar1;
  ulong uVar2;
  char buffer [20];
  char acStack_48 [32];
  
  this_00 = (Fl_Check_Browser *)operator_new(0x290);
  Fl_Check_Browser::Fl_Check_Browser(this_00,x,y,w,h,(char *)0x0);
  if (batch_mode == 0) {
    uVar2 = 1;
    do {
      sprintf(acStack_48,"Browser Line %d",uVar2);
      Fl_Check_Browser::add(this_00,acStack_48);
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0x15);
  }
  return (Fl_Widget *)this_00;
}

Assistant:

Fl_Widget *widget(int x,int y,int w,int h) {
    Fl_Check_Browser* b = new Fl_Check_Browser(x,y,w,h);
    // Fl_Check_Browser::add calls fl_height(), which requires the X display open.
    // Avoid this when compiling so it works w/o a display:
    if (!batch_mode) {
      char buffer[20];
      for (int i = 1; i <= 20; i++) {
	sprintf(buffer,"Browser Line %d",i);
	b->add(buffer);
      }
    }
    return b;
  }